

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

void tokthadd(toktdef *toktab1,char *name,int namel,int typ,int val,int hash)

{
  osfildef *poVar1;
  undefined8 *puVar2;
  size_t sVar3;
  undefined1 in_CL;
  int in_EDX;
  void *in_RSI;
  errcxdef *in_RDI;
  undefined2 in_R8W;
  int in_R9D;
  mcmcxdef *mctx;
  tokthdef *toktab;
  tokshdef *symh;
  toksdef *sym;
  int siz;
  errcxdef *nump;
  
  if ((int)(uint)*(ushort *)&in_RDI[4].errcxseek < in_EDX + 0x10) {
    if (0x7f < *(uint *)(in_RDI[3].errcxbuf + 0x144)) {
      errsigf(in_RDI,*(char **)(in_RDI->errcxbuf + 0x14),0);
    }
    nump = in_RDI;
    mcmunlck((mcmcxdef *)in_RDI,(mcmon)((ulong)*(char **)(in_RDI->errcxbuf + 0x14) >> 0x30));
    *(uint *)(in_RDI[4].errcxbuf + (ulong)*(uint *)(in_RDI[3].errcxbuf + 0x144) * 4) =
         (uint)*(ushort *)((long)&in_RDI[4].errcxseek + 2);
    *(int *)(in_RDI[3].errcxbuf + 0x144) = *(int *)(in_RDI[3].errcxbuf + 0x144) + 1;
    poVar1 = (osfildef *)
             mcmalo0((mcmcxdef *)toktab,mctx._6_2_,(mcmon *)nump,(mcmon)((ulong)in_RSI >> 0x30),
                     (int)in_RSI);
    in_RDI[4].errcxfp = poVar1;
    *(undefined2 *)&in_RDI[4].errcxseek = 0x1000;
    *(undefined2 *)((long)&in_RDI[4].errcxseek + 2) = 0;
  }
  puVar2 = (undefined8 *)
           ((long)&(in_RDI[4].errcxfp)->_flags +
           (long)(int)(uint)*(ushort *)((long)&in_RDI[4].errcxseek + 2));
  *puVar2 = *(undefined8 *)(in_RDI->errcxbuf + (long)in_R9D * 8 + 0x1c);
  *(undefined2 *)(in_RDI->errcxbuf + (long)in_R9D * 8 + 0x1c) =
       *(undefined2 *)
        (in_RDI[3].errcxbuf + (ulong)*(uint *)(in_RDI[3].errcxbuf + 0x144) * 2 + 0x148);
  *(uint *)(in_RDI->errcxbuf + (long)in_R9D * 8 + 0x20) =
       (uint)*(ushort *)((long)&in_RDI[4].errcxseek + 2);
  *(undefined2 *)((long)puVar2 + 10) = in_R8W;
  *(char *)((long)puVar2 + 0xe) = (char)in_EDX;
  *(undefined1 *)(puVar2 + 1) = in_CL;
  *(char *)((long)puVar2 + 9) = (char)in_R9D;
  *(undefined2 *)((long)puVar2 + 0xc) = 0;
  memcpy((void *)((long)puVar2 + 0xf),in_RSI,(long)in_EDX);
  sVar3 = osrndsz((long)(in_EDX + 0x10));
  *(short *)((long)&in_RDI[4].errcxseek + 2) =
       *(short *)((long)&in_RDI[4].errcxseek + 2) + (short)sVar3;
  if ((int)(uint)*(ushort *)&in_RDI[4].errcxseek < (int)sVar3) {
    *(undefined2 *)&in_RDI[4].errcxseek = 0;
  }
  else {
    *(short *)&in_RDI[4].errcxseek = *(short *)&in_RDI[4].errcxseek - (short)sVar3;
  }
  return;
}

Assistant:

void tokthadd(toktdef *toktab1, char *name, int namel,
              int typ, int val, int hash)
{
    int       siz = sizeof(toksh1def) + namel;
    toksdef  *sym;
    tokshdef *symh;
    tokthdef *toktab = (tokthdef *)toktab1;
    
    if (toktab->tokthsize < siz)
    {
        mcmcxdef *mctx = toktab->tokthmem;
        
        /* insufficient space in current pool; add a new pool */
        if (toktab->tokthpcnt >= TOKPOOLMAX)
            errsig(toktab->tokthsc.tokterr, ERR_MANYSYM);

        /* unlock current pool page, and note its final size */
        mcmunlck(mctx, toktab->tokthpool[toktab->tokthpcnt]);
        toktab->tokthfinal[toktab->tokthpcnt] = toktab->tokthofs;

        /* allocate a new pool page, and leave it locked */
        toktab->tokthcpool = mcmalo(mctx, (ushort)TOKTHSIZE,
                                   &toktab->tokthpool[++(toktab->tokthpcnt)]);
        toktab->tokthsize = TOKTHSIZE;
        toktab->tokthofs = 0;
    }
    symh = (tokshdef *)(toktab->tokthcpool + toktab->tokthofs);
    sym = &symh->tokshsc;
    
    /* link into list for this hash value */
    OSCPYSTRUCT(symh->tokshnxt, toktab->tokthhsh[hash]);
    toktab->tokthhsh[hash].tokthpobj = toktab->tokthpool[toktab->tokthpcnt];
    toktab->tokthhsh[hash].tokthpofs = toktab->tokthofs;
    
    /* fill in rest of toksdef */
    sym->toksval = val;
    sym->tokslen = namel;
    sym->tokstyp = typ;
    sym->tokshsh = hash;
    sym->toksfr  = 0;
    memcpy(sym->toksnam, name, (size_t)namel);
    
    /* update free pool pointer */
    siz = osrndsz(siz);
    toktab->tokthofs += siz;
    if (siz > toktab->tokthsize) toktab->tokthsize = 0;
    else toktab->tokthsize -= siz;
}